

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O0

OmegaSN * slopeSN(vector<double,_std::allocator<double>_> *data,
                 vector<double,_std::allocator<double>_> *states,uint nbSegments,string *constraint)

{
  double firstdata;
  bool bVar1;
  OmegaSN *this;
  reference pvVar2;
  size_type sVar3;
  OmegaSN *omega;
  string *constraint_local;
  uint nbSegments_local;
  vector<double,_std::allocator<double>_> *states_local;
  vector<double,_std::allocator<double>_> *data_local;
  
  this = (OmegaSN *)operator_new(0x70);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](data,0);
  firstdata = *pvVar2;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  OmegaSN::OmegaSN(this,states,firstdata,nbSegments,(uint)sVar3);
  bVar1 = std::operator==(constraint,"null");
  if (bVar1) {
    OmegaSN::algoNULL(this,data);
  }
  bVar1 = std::operator==(constraint,"isotonic");
  if (bVar1) {
    OmegaSN::algoISOTONIC(this,data);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  OmegaSN::backtracking(this,(uint)sVar3);
  return this;
}

Assistant:

OmegaSN *slopeSN(std::vector<double> data, std::vector<double> states,
                    unsigned int nbSegments, std::string constraint = "null")
{
  OmegaSN *omega = new OmegaSN(states, data[0], nbSegments, data.size());
  //DIFFERENT CONSTRAINTS
  if(constraint == "null"){omega->algoNULL(data);}
  if(constraint == "isotonic"){omega->algoISOTONIC(data);}

  omega->backtracking(data.size());

  return omega;
}